

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMeshControl::PrintSubdomain(TPZMHMeshControl *this,int64_t elindex,ostream *out)

{
  bool bVar1;
  TPZCompEl **ppTVar2;
  TPZGeoEl *pTVar3;
  long lVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  TPZCompEl *pTVar7;
  int64_t i;
  long lVar8;
  _Self __tmp;
  multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> interfaces;
  set<long,_std::less<long>,_std::allocator<long>_> celindices;
  TPZStack<TPZCompElSide,_10> boundaries;
  int64_t local_168;
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  local_160;
  pair<long,_long> local_130;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_120;
  TPZManVector<TPZCompElSide,_10> local_f0;
  
  lVar8 = (((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_160._M_impl.super__Rb_tree_header._M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right =
       local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  TPZStack<TPZCompElSide,_10>::TPZStack((TPZStack<TPZCompElSide,_10> *)&local_f0);
  for (local_168 = 0; local_168 < lVar8; local_168 = local_168 + 1) {
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZCompEl_*,_10>,local_168);
    pTVar7 = *ppTVar2;
    pTVar3 = TPZCompEl::Reference(pTVar7);
    if (pTVar3 != (TPZGeoEl *)0x0) {
      if ((this->fGeoToMHMDomain).super_TPZVec<long>.fStore[pTVar3->fIndex] == elindex) {
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   &local_120,&local_168);
        AddElementBoundaries(this,elindex,local_168,(TPZStack<TPZCompElSide,_10> *)&local_f0);
      }
      lVar4 = __dynamic_cast(pTVar7,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
      if (lVar4 != 0) {
        pTVar7 = *(TPZCompEl **)(lVar4 + 0x28);
        pTVar3 = TPZCompEl::Reference(pTVar7);
        bVar1 = IsSibling(this,pTVar3->fIndex,elindex);
        if (bVar1) {
          local_130.first = pTVar7->fIndex;
          local_130.second = local_168;
          std::
          _Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
          ::_M_emplace_equal<std::pair<long,long>>
                    ((_Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
                      *)&local_160,&local_130);
        }
      }
    }
  }
  poVar5 = std::operator<<(out,"Diagnostics for subdomain formed by element seed ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(out,"Number of computational elements contained in the group ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(out,"Comp Element indices ");
  for (p_Var6 = local_120._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_120._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::ostream::_M_insert<long>((long)out);
    std::operator<<(poVar5," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar5 = std::operator<<(out,"Number of boundary interfaces ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  for (p_Var6 = local_160._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_160._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZCompEl_*,_10>,(int64_t)p_Var6[1]._M_parent);
    if (*ppTVar2 == (TPZCompEl *)0x0) {
LAB_011e6490:
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                 ,0x39a);
    }
    pTVar7 = (TPZCompEl *)
             __dynamic_cast(*ppTVar2,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
    if (pTVar7 == (TPZCompEl *)0x0) goto LAB_011e6490;
    poVar5 = std::operator<<(out,"Comp Element index ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," side ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&pTVar7[1].fMesh);
    poVar5 = std::operator<<(poVar5," skeleton element ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," interface index ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," face material id ");
    pTVar3 = TPZCompEl::Reference(pTVar7);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar3->fMatId);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  poVar5 = std::operator<<(out,"Number of elements on the sides of elseed ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  lVar4 = 0;
  for (lVar8 = 0; lVar8 < local_f0.super_TPZVec<TPZCompElSide>.fNElements; lVar8 = lVar8 + 1) {
    poVar5 = std::operator<<(out,"Comp Element index ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," side ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,*(int *)((long)&(local_f0.super_TPZVec<TPZCompElSide>.fStore)->fSide
                                       + lVar4));
    std::endl<char,std::char_traits<char>>(poVar5);
    lVar4 = lVar4 + 0x10;
  }
  std::operator<<(out,"Geom Element indices ");
  for (p_Var6 = local_120._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_120._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZCompEl_*,_10>,*(int64_t *)(p_Var6 + 1));
    TPZCompEl::Reference(*ppTVar2);
    poVar5 = std::ostream::_M_insert<long>((long)out);
    std::operator<<(poVar5," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar5 = std::operator<<(out,"Number of boundary interfaces ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  p_Var6 = local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var6 == &local_160._M_impl.super__Rb_tree_header) {
      poVar5 = std::operator<<(out,"Number of elements on the sides of elseed ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      lVar4 = 0;
      for (lVar8 = 0; lVar8 < local_f0.super_TPZVec<TPZCompElSide>.fNElements; lVar8 = lVar8 + 1) {
        poVar5 = std::operator<<(out,"Geom Element index ");
        TPZCompEl::Reference
                  (*(TPZCompEl **)
                    ((long)&(local_f0.super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar4));
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        poVar5 = std::operator<<(poVar5," side ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,*(int *)((long)&(local_f0.super_TPZVec<TPZCompElSide>.fStore)->
                                                   fSide + lVar4));
        std::endl<char,std::char_traits<char>>(poVar5);
        lVar4 = lVar4 + 0x10;
      }
      TPZManVector<TPZCompElSide,_10>::~TPZManVector(&local_f0);
      std::
      _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
      ::~_Rb_tree(&local_160);
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&local_120);
      return;
    }
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZCompEl_*,_10>,(int64_t)p_Var6[1]._M_parent);
    if (*ppTVar2 == (TPZCompEl *)0x0) break;
    pTVar7 = (TPZCompEl *)
             __dynamic_cast(*ppTVar2,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
    if (pTVar7 == (TPZCompEl *)0x0) break;
    poVar5 = std::operator<<(out,"Geom Element index ");
    TPZCompEl::Reference(*(TPZCompEl **)(pTVar7 + 1));
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," side ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&pTVar7[1].fMesh);
    poVar5 = std::operator<<(poVar5," skeleton element ");
    TPZCompEl::Reference((TPZCompEl *)pTVar7[1].fIndex);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," interface index ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5," face material id ");
    pTVar3 = TPZCompEl::Reference(pTVar7);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar3->fMatId);
    std::endl<char,std::char_traits<char>>(poVar5);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
             ,0x3ae);
}

Assistant:

void TPZMHMeshControl::PrintSubdomain(int64_t elindex, std::ostream &out)
{
    int64_t nel = fCMesh->NElements();
    std::set<int64_t> celindices;
    std::multimap<int64_t,int64_t> interfaces;
    TPZStack<TPZCompElSide> boundaries;
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int64_t gelindex = gel->Index();
        if(fGeoToMHMDomain[gelindex] == elindex)
        {
            celindices.insert(el);
            // verify whether their neighbours are in the subdomain
            AddElementBoundaries(elindex, el, boundaries);
        }
        TPZInterfaceElement *iface = dynamic_cast<TPZInterfaceElement *>(cel);
        if (iface) {
            TPZCompEl *left = iface->LeftElement();
            TPZGeoEl *gleft = left->Reference();
            if (IsSibling(gleft->Index(), elindex)) {
                interfaces.insert(std::make_pair(left->Index(),el));
            }
        }
    }
    out << "Diagnostics for subdomain formed by element seed " << elindex << std::endl;
    out << "Number of computational elements contained in the group " << celindices.size() << std::endl;
    out << "Comp Element indices ";
    for (std::set<int64_t>::iterator i=celindices.begin(); i != celindices.end(); i++) {
        out << *i << " ";
    }
    out << std::endl;
    out << "Number of boundary interfaces " << interfaces.size() << std::endl;
    for (std::multimap<int64_t, int64_t>::iterator i = interfaces.begin(); i != interfaces.end(); i++) {
        int64_t el = i->second;
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZInterfaceElement *face = dynamic_cast<TPZInterfaceElement *>(cel);
        if (!face) {
            DebugStop();
        }
        out << "Comp Element index " << face->LeftElement()->Index() << " side " << face->LeftElementSide().Side() << " skeleton element " << face->RightElement()->Index() << " interface index "
            << face->Index() << " face material id " << face->Reference()->MaterialId() << std::endl;
    }
    out << "Number of elements on the sides of elseed " << boundaries.size() << std::endl;
    for (int64_t i=0; i<boundaries.size(); i++) {
        out << "Comp Element index " << boundaries[i].Element()->Index() << " side " << boundaries[i].Side() << std::endl;
    }
    out << "Geom Element indices ";
    for (std::set<int64_t>::iterator i=celindices.begin(); i != celindices.end(); i++) {
        out << fCMesh->ElementVec()[*i]->Reference()->Index() << " ";
    }
    out << std::endl;
    out << "Number of boundary interfaces " << interfaces.size() << std::endl;
    for (std::multimap<int64_t, int64_t>::iterator i = interfaces.begin(); i != interfaces.end(); i++) {
        int64_t el = i->second;
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        TPZInterfaceElement *face = dynamic_cast<TPZInterfaceElement *>(cel);
        if (!face) {
            DebugStop();
        }
        out << "Geom Element index " << face->LeftElement()->Reference()->Index() << " side " << face->LeftElementSide().Side() << " skeleton element " << face->RightElement()->Reference()->Index() << " interface index "
        << face->Index() << " face material id " << face->Reference()->MaterialId() << std::endl;
    }
    out << "Number of elements on the sides of elseed " << boundaries.size() << std::endl;
    for (int64_t i=0; i<boundaries.size(); i++) {
        out << "Geom Element index " << boundaries[i].Element()->Reference()->Index() << " side " << boundaries[i].Side() << std::endl;
    }
}